

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O2

void updateSymbolFilename(Symbol *sym)

{
  FileStackNode *pFVar1;
  
  pFVar1 = sym->src;
  setSymbolFilename(sym);
  if (((pFVar1 != (FileStackNode *)0x0) && (pFVar1->referenced == true)) &&
     (pFVar1->ID != 0xffffffff)) {
    out_RegisterNode(sym->src);
    return;
  }
  return;
}

Assistant:

static void updateSymbolFilename(struct Symbol *sym)
{
	struct FileStackNode *oldSrc = sym->src;

	setSymbolFilename(sym);
	// If the old node was referenced, ensure the new one is
	if (oldSrc && oldSrc->referenced && oldSrc->ID != (uint32_t)-1)
		out_RegisterNode(sym->src);
	// TODO: unref the old node, and use `out_ReplaceNode` instead of deleting it
}